

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O3

dec_proc2_output __thiscall
sophia_interface::dec_proc2(sophia_interface *this,double x,int IRES,int L0)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  dec_proc2_output extraout_RAX;
  runtime_error *prVar5;
  int in_ECX;
  double *pdVar6;
  int *piVar7;
  int iVar8;
  int extraout_EDX;
  ulong uVar9;
  sophia_interface *this_00;
  int in_R8D;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double __x;
  double dVar14;
  runtime_error local_118 [16];
  runtime_error local_108 [16];
  runtime_error local_f8 [16];
  runtime_error local_e8 [16];
  runtime_error local_d8 [16];
  runtime_error local_c8 [16];
  runtime_error local_b8 [16];
  runtime_error local_a8 [16];
  runtime_error local_98 [16];
  runtime_error local_88 [16];
  runtime_error local_78 [16];
  runtime_error local_68 [16];
  runtime_error local_58 [16];
  runtime_error local_48 [16];
  undefined1 local_38 [24];
  
  local_38._16_8_ = x;
  if (L0 == 0xe) {
    uVar12 = 0;
    dVar13 = RLU(this,false);
    iVar11 = *(int *)(&DAT_00131afc + (long)IRES * 4);
    lVar4 = (long)IRES + -1;
    if (iVar11 < 1) {
LAB_001082e4:
      uVar1 = IDBRES1n[lVar4];
      if (uVar1 == 0) {
        local_38._16_8_ = dVar13;
        std::runtime_error::runtime_error(local_a8,"invalid resonance in this energy range");
        std::runtime_error::~runtime_error(local_a8);
        dVar13 = (double)local_38._16_8_;
      }
      pdVar6 = CBRRES1n + (int)(uVar1 - 1);
      uVar3 = 0xffffffff;
      dVar14 = 0.0;
      do {
        uVar10 = uVar1;
        bVar2 = dVar14 <= dVar13;
        dVar14 = *pdVar6;
        uVar1 = uVar3;
        if (bVar2) {
          uVar1 = uVar10;
        }
        if (dVar14 <= dVar13) {
          uVar1 = uVar3;
        }
        uVar3 = uVar1;
        pdVar6 = pdVar6 + 1;
        uVar1 = uVar10 + 1;
      } while (dVar14 < 1.0);
      if (dVar13 != 1.0) {
        uVar10 = uVar3;
      }
      if (NAN(dVar13)) {
        uVar10 = uVar3;
      }
      if (uVar10 != 0xffffffff) {
LAB_0010837a:
        uVar9 = (ulong)uVar10;
        uVar12 = 0x100000000;
        goto LAB_001083d9;
      }
      prVar5 = local_98;
LAB_001083b9:
      std::runtime_error::runtime_error(prVar5,"no resonance decay possible !");
      uVar12 = 1;
    }
    else {
      iVar8 = IRES * 4 + -4;
      if (iVar8 + iVar11 + -1 <= iVar8) {
LAB_00108386:
        prVar5 = local_48;
        goto LAB_001083a1;
      }
      uVar12 = 0;
      uVar9 = 1;
      do {
        if (((double)local_38._16_8_ <= RESLIMn[(long)iVar8 + uVar9]) &&
           (pdVar6 = (double *)((long)iVar8 * 8 + 0x1319a8 + uVar9 * 8),
           *pdVar6 <= (double)local_38._16_8_ && (double)local_38._16_8_ != *pdVar6)) {
          uVar12 = uVar9 & 0xffffffff;
        }
        uVar9 = uVar9 + 1;
      } while (iVar11 != (int)uVar9);
      iVar11 = (int)uVar12;
      if (iVar11 == 3) {
        uVar1 = IDBRES3n[lVar4];
        if (uVar1 == 0) {
          local_38._16_8_ = dVar13;
          std::runtime_error::runtime_error(local_68,"invalid resonance in this energy range");
          std::runtime_error::~runtime_error(local_68);
          dVar13 = (double)local_38._16_8_;
        }
        pdVar6 = CBRRES3n + (int)(uVar1 - 1);
        uVar3 = 0xffffffff;
        dVar14 = 0.0;
        do {
          uVar10 = uVar1;
          bVar2 = dVar14 <= dVar13;
          dVar14 = *pdVar6;
          uVar1 = uVar3;
          if (bVar2) {
            uVar1 = uVar10;
          }
          if (dVar14 <= dVar13) {
            uVar1 = uVar3;
          }
          uVar3 = uVar1;
          pdVar6 = pdVar6 + 1;
          uVar1 = uVar10 + 1;
        } while (dVar14 < 1.0);
        if (dVar13 != 1.0) {
          uVar10 = uVar3;
        }
        if (NAN(dVar13)) {
          uVar10 = uVar3;
        }
        if (uVar10 != 0xffffffff) goto LAB_0010867a;
        prVar5 = local_58;
LAB_001086b8:
        std::runtime_error::runtime_error(prVar5,"no resonance decay possible !");
        uVar12 = 3;
      }
      else {
        if (iVar11 != 2) {
          if (iVar11 == 1) goto LAB_001082e4;
          goto LAB_00108386;
        }
        uVar1 = IDBRES2n[lVar4];
        if (uVar1 == 0) {
          local_38._16_8_ = dVar13;
          std::runtime_error::runtime_error(local_88,"invalid resonance in this energy range");
          std::runtime_error::~runtime_error(local_88);
          dVar13 = (double)local_38._16_8_;
        }
        pdVar6 = CBRRES2n + (int)(uVar1 - 1);
        uVar3 = 0xffffffff;
        dVar14 = 0.0;
        do {
          uVar10 = uVar1;
          bVar2 = dVar14 <= dVar13;
          dVar14 = *pdVar6;
          uVar1 = uVar3;
          if (bVar2) {
            uVar1 = uVar10;
          }
          if (dVar14 <= dVar13) {
            uVar1 = uVar3;
          }
          uVar3 = uVar1;
          pdVar6 = pdVar6 + 1;
          uVar1 = uVar10 + 1;
        } while (dVar14 < 1.0);
        if (dVar13 != 1.0) {
          uVar10 = uVar3;
        }
        if (NAN(dVar13)) {
          uVar10 = uVar3;
        }
        if (uVar10 != 0xffffffff) goto LAB_0010852e;
        prVar5 = local_78;
LAB_00108697:
        std::runtime_error::runtime_error(prVar5,"no resonance decay possible !");
        uVar12 = 2;
      }
    }
  }
  else {
    if (L0 != 0xd) {
      this_00 = (sophia_interface *)local_38;
      dec_proc2(this_00);
      this_00->np = 2;
      if (in_R8D == 0xe) {
        if (in_ECX == 3) {
          lVar4 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES3n;
        }
        else if (in_ECX == 2) {
          lVar4 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES2n;
        }
        else {
          if (in_ECX != 1) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar5,"error in RES_DECAY3");
            goto LAB_0010885a;
          }
          lVar4 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES1n;
        }
      }
      else {
        if (in_R8D != 0xd) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar5,"no valid L0 in RES_DECAY3");
LAB_0010885a:
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (in_ECX == 3) {
          lVar4 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES3p;
        }
        else if (in_ECX == 2) {
          lVar4 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES2p;
        }
        else {
          if (in_ECX != 1) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar5,"error in RES_DECAY3");
            goto LAB_0010885a;
          }
          lVar4 = (long)(extraout_EDX * 5 + -3);
          piVar7 = KDECRES1p;
        }
      }
      iVar11 = piVar7[lVar4];
      iVar8 = piVar7[extraout_EDX * 5 + -2];
      this_00->LLIST[0] = iVar11;
      this_00->LLIST[1] = iVar8;
      dVar13 = scatterangle(this_00,IRES,in_R8D);
      if (__x < 0.0) {
        dVar14 = sqrt(__x);
      }
      else {
        dVar14 = SQRT(__x);
      }
      PROC_TWOPART(this_00,iVar11,iVar8,dVar14,dVar13);
      return extraout_RAX;
    }
    uVar12 = 0;
    dVar13 = RLU(this,false);
    iVar11 = *(int *)((long)RESLIMn + (long)IRES * 4 + 0x11c);
    lVar4 = (long)IRES + -1;
    if (iVar11 < 1) {
LAB_001081ae:
      uVar1 = IDBRES1p[lVar4];
      if (uVar1 == 0) {
        local_38._16_8_ = dVar13;
        std::runtime_error::runtime_error(local_118,"invalid resonance in energy range 1");
        std::runtime_error::~runtime_error(local_118);
        dVar13 = (double)local_38._16_8_;
      }
      pdVar6 = CBRRES1p + (int)(uVar1 - 1);
      uVar3 = 0xffffffff;
      dVar14 = 0.0;
      do {
        uVar10 = uVar1;
        bVar2 = dVar14 <= dVar13;
        dVar14 = *pdVar6;
        uVar1 = uVar3;
        if (bVar2) {
          uVar1 = uVar10;
        }
        if (dVar14 <= dVar13) {
          uVar1 = uVar3;
        }
        uVar3 = uVar1;
        pdVar6 = pdVar6 + 1;
        uVar1 = uVar10 + 1;
      } while (dVar14 < 1.0);
      if (dVar13 != 1.0) {
        uVar10 = uVar3;
      }
      if (NAN(dVar13)) {
        uVar10 = uVar3;
      }
      if (uVar10 != 0xffffffff) goto LAB_0010837a;
      prVar5 = local_108;
      goto LAB_001083b9;
    }
    iVar8 = IRES * 4 + -4;
    if (iVar8 < iVar8 + iVar11 + -1) {
      uVar12 = 0;
      uVar9 = 1;
      do {
        if (((double)local_38._16_8_ <= RESLIMp[(long)iVar8 + uVar9]) &&
           (pdVar6 = (double *)((long)iVar8 * 8 + 0x131888 + uVar9 * 8),
           *pdVar6 <= (double)local_38._16_8_ && (double)local_38._16_8_ != *pdVar6)) {
          uVar12 = uVar9 & 0xffffffff;
        }
        uVar9 = uVar9 + 1;
      } while (iVar11 != (int)uVar9);
      iVar11 = (int)uVar12;
      if (iVar11 == 3) {
        uVar1 = IDBRES3p[lVar4];
        if (uVar1 == 0) {
          local_38._16_8_ = dVar13;
          std::runtime_error::runtime_error(local_d8,"invalid resonance in energy range 3");
          std::runtime_error::~runtime_error(local_d8);
          dVar13 = (double)local_38._16_8_;
        }
        pdVar6 = CBRRES3p + (int)(uVar1 - 1);
        uVar3 = 0xffffffff;
        dVar14 = 0.0;
        do {
          uVar10 = uVar1;
          bVar2 = dVar14 <= dVar13;
          dVar14 = *pdVar6;
          uVar1 = uVar3;
          if (bVar2) {
            uVar1 = uVar10;
          }
          if (dVar14 <= dVar13) {
            uVar1 = uVar3;
          }
          uVar3 = uVar1;
          pdVar6 = pdVar6 + 1;
          uVar1 = uVar10 + 1;
        } while (dVar14 < 1.0);
        if (dVar13 != 1.0) {
          uVar10 = uVar3;
        }
        if (NAN(dVar13)) {
          uVar10 = uVar3;
        }
        if (uVar10 == 0xffffffff) {
          prVar5 = local_c8;
          goto LAB_001086b8;
        }
LAB_0010867a:
        uVar9 = (ulong)uVar10;
        uVar12 = 0x300000000;
        goto LAB_001083d9;
      }
      if (iVar11 == 2) {
        uVar1 = IDBRES2p[lVar4];
        if (uVar1 == 0) {
          local_38._16_8_ = dVar13;
          std::runtime_error::runtime_error(local_f8,"invalid resonance in energy range 2");
          std::runtime_error::~runtime_error(local_f8);
          dVar13 = (double)local_38._16_8_;
        }
        pdVar6 = CBRRES2p + (int)(uVar1 - 1);
        uVar3 = 0xffffffff;
        dVar14 = 0.0;
        do {
          uVar10 = uVar1;
          bVar2 = dVar14 <= dVar13;
          dVar14 = *pdVar6;
          uVar1 = uVar3;
          if (bVar2) {
            uVar1 = uVar10;
          }
          if (dVar14 <= dVar13) {
            uVar1 = uVar3;
          }
          uVar3 = uVar1;
          pdVar6 = pdVar6 + 1;
          uVar1 = uVar10 + 1;
        } while (dVar14 < 1.0);
        if (dVar13 != 1.0) {
          uVar10 = uVar3;
        }
        if (NAN(dVar13)) {
          uVar10 = uVar3;
        }
        if (uVar10 == 0xffffffff) {
          prVar5 = local_e8;
          goto LAB_00108697;
        }
LAB_0010852e:
        uVar9 = (ulong)uVar10;
        uVar12 = 0x200000000;
        goto LAB_001083d9;
      }
      if (iVar11 == 1) goto LAB_001081ae;
    }
    prVar5 = local_b8;
LAB_001083a1:
    std::runtime_error::runtime_error(prVar5,"invalid IRANGE in DEC_PROC2");
  }
  std::runtime_error::~runtime_error(prVar5);
  uVar12 = uVar12 << 0x20;
  uVar9 = 0xffffffff;
LAB_001083d9:
  return (dec_proc2_output)(uVar9 | uVar12);
}

Assistant:

dec_proc2_output sophia_interface::dec_proc2(double x, int IRES, int L0) {
// decide which decay with ID=IPROC of resonance IRES takes place ***
// Date: 20/01/98   **
// correct.: 27/04/98*
// author: A.Muecke **
    int IPROC = 0;
    int IRANGE = 0;
    double prob_sum[10] = {0.};

    // choose arrays /S_RESp/ for charged resonances,
    //        arrays /S_RESn/ for neutral resonances
    if (L0 == 13) {
        // charged resonances:
        double r = RNDM();
        // determine the energy range of the resonance:
        int nlim = ELIMITSp[IRES - 1];
        int istart = (IRES - 1) * 4 + 1;
        if (nlim > 0) {
            for (int ie = istart; ie < nlim - 2 + istart + 1; ++ie) {
                double reslimp1 = RESLIMp[ie - 1];
                double reslimp2 = RESLIMp[ie];
                if (x <= reslimp2 && x > reslimp1) {
                    IRANGE = ie + 1 - istart;
                }
            }
        } else {
            IRANGE = 1;
        }

        IPROC = -1;
        int i = 0;
        int j = 0;
        prob_sum[0] = 0.;
        if (IRANGE == 1) {
            j = IDBRES1p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 1");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES1p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 2) {
            j = IDBRES2p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 2");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES2p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 3) {
            j = IDBRES3p[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in energy range 3");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES3p[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else {
            std::runtime_error("invalid IRANGE in DEC_PROC2");
        }
        
        // output
        dec_proc2_output dpo;
        dpo.IPROC = IPROC;
        dpo.IRANGE = IRANGE;
        return dpo;
    } else if (L0 == 14) {
        // neutral resonances:
        double r = RNDM();
        //determine the energy range of the resonance:
        int nlim = ELIMITSn[IRES - 1];
        int istart = (IRES-1) * 4 + 1;
        if (nlim > 0) {
            for (int ie = istart; ie < nlim - 2 + istart + 1; ++ie) {
                if (x <= RESLIMn[ie] && x > RESLIMn[ie - 1]) {
                    IRANGE = ie + 1 - istart;
                }
            }
        } else {
            IRANGE = 1;
        }
        IPROC = -1;
        int i = 0;
        int j = 0;
        prob_sum[0] = 0.;
        if (IRANGE == 1) {
            j = IDBRES1n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES1n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
                if (r == 1.) IPROC = j;
                if (IPROC == -1) {
                    std::runtime_error("no resonance decay possible !");
                }
        } else if (IRANGE == 2) {
            j = IDBRES2n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                prob_sum[i] = CBRRES2n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else if (IRANGE == 3) {
            j = IDBRES3n[IRES - 1] - 1;
            if (j == -1) {
                std::runtime_error("invalid resonance in this energy range");
            }
            do {
                j++;
                i++;
                    prob_sum[i] = CBRRES3n[j - 1];
                if (r >= prob_sum[i - 1] && r < prob_sum[i]) IPROC = j;
            } while (prob_sum[i] < 1.);
            if (r == 1.) IPROC = j;
            if (IPROC == -1) {
                std::runtime_error("no resonance decay possible !");
            }
        } else {
            std::runtime_error("invalid IRANGE in DEC_PROC2");
        }
        // output
        dec_proc2_output dpo;
        dpo.IPROC = IPROC;
        dpo.IRANGE = IRANGE;
        return dpo;
    } else {
        std::runtime_error("no valid L0 in DEC_PROC !");
    }    
}